

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
poly::vector<Interface,std::allocator<Interface>,poly::virtual_cloning_policy>::
push_back_new_elem_w_storage_increase<Impl2T<poly::virtual_cloning_policy>,Impl2T<poly::virtual_cloning_policy>>
          (vector<Interface,std::allocator<Interface>,poly::virtual_cloning_policy> *this,
          long param_2)

{
  void_pointer pvVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  __atomic_base<unsigned_long> _Var4;
  size_t a;
  long lVar5;
  ulong uVar6;
  long lVar7;
  _Head_base<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
  _Var8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong max_align;
  undefined8 *puVar13;
  ulong uVar14;
  allocator_base<std::allocator<unsigned_char>_> local_68;
  vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
  *local_58;
  vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
  *pvStack_50;
  ulong local_48;
  poly_copy_descr local_38;
  
  lVar7 = *(long *)this;
  lVar5 = *(long *)(this + 0x10);
  uVar14 = (ulong)(*(long *)(this + 0x18) - lVar7) >> 4 & 0xfffffffffffffffe;
  uVar14 = uVar14 + (uVar14 == 0);
  max_align = 0x40;
  if (0x40 < *(ulong *)(this + 0x20)) {
    max_align = *(ulong *)(this + 0x20);
  }
  uVar9 = (max_align - (max_align + 0xff) % max_align) + 0xff;
  uVar11 = max_align;
  if (lVar7 == lVar5) {
    uVar10 = lVar5 - lVar7 >> 5;
    uVar6 = uVar9;
  }
  else {
    lVar12 = lVar7;
    do {
      uVar6 = *(long *)(lVar12 + 0x10) + (max_align - 1);
      uVar11 = (uVar11 - uVar6 % max_align) + uVar6;
      lVar12 = lVar12 + 0x20;
    } while (lVar12 != lVar5);
    uVar10 = lVar5 - lVar7 >> 5;
    uVar6 = (uVar10 + uVar9 + uVar11) / (uVar10 + 1);
  }
  lVar7 = 0;
  if (uVar10 <= uVar14) {
    lVar7 = uVar14 - uVar10;
  }
  local_58 = (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
              *)0x0;
  pvStack_50 = (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
                *)0x0;
  local_68._storage =
       (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
        *)0x0;
  local_68._end_storage = (void_pointer)0x0;
  local_48 = 8;
  vector_impl::allocator_base<std::allocator<unsigned_char>_>::allocate
            (&local_68,uVar9 + uVar14 * 0x20 + uVar11 + lVar7 * uVar6);
  local_58 = (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
              *)local_68._storage;
  pvStack_50 = (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
                *)((long)local_68._storage + uVar14 * 0x20);
  local_48 = max_align;
  vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::
  poly_uninitialized_copy
            (&local_38,&local_68,local_68._storage,*(elem_ptr_const_pointer *)this,
             *(elem_ptr_const_pointer *)(this + 0x10),*(elem_ptr_const_pointer *)this + uVar14,
             max_align);
  local_58 = local_38.
             super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
             .
             super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
             ._M_head_impl;
  pvStack_50 = local_38.
               super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
               .
               super__Tuple_impl<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
               .
               super__Head_base<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
               ._M_head_impl;
  if ((local_38.
       super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
       .
       super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
       ._M_head_impl !=
       local_38.
       super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
       .
       super__Tuple_impl<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
       .
       super__Head_base<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
       ._M_head_impl) && (0x3f < local_48)) {
    _Var8._M_head_impl =
         local_38.
         super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
         .
         super__Tuple_impl<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
         .
         super__Head_base<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
         ._M_head_impl;
    if (local_38.
        super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
        .
        super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
        ._M_head_impl !=
        (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
         *)local_68._storage) {
      _Var8._M_head_impl =
           (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
            *)((long)local_38.
                     super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
                     .
                     super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
                     ._M_head_impl[-1].ptr.first +
              local_38.
              super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
              .
              super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
              ._M_head_impl[-1].sf.first);
    }
    lVar7 = local_48 - ((long)_Var8._M_head_impl + (local_48 - 1)) % local_48;
    lVar5 = lVar7 + -1;
    if ((void_pointer)((long)_Var8._M_head_impl + lVar7 + 0xff) <= local_68._end_storage) {
      *(undefined ***)((long)_Var8._M_head_impl + lVar5) = &PTR___cxa_pure_virtual_002b4808;
      LOCK();
      UNLOCK();
      _Var4._M_i = (Interface::last_id.super___atomic_base<unsigned_long>._M_i + 1)._M_i;
      ((__atomic_base<unsigned_long> *)((long)_Var8._M_head_impl + lVar7 + 7))->_M_i =
           (__int_type)Interface::last_id.super___atomic_base<unsigned_long>._M_i;
      Interface::last_id.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
      *(undefined1 *)((long)_Var8._M_head_impl + lVar7 + 0xf) = 0;
      *(undefined ***)((long)_Var8._M_head_impl + lVar5) = &PTR_function_002b4840;
      uVar3 = *(undefined8 *)(param_2 + 0x20);
      puVar13 = (undefined8 *)((long)_Var8._M_head_impl + lVar7 + 0x17);
      *puVar13 = *(undefined8 *)(param_2 + 0x18);
      puVar13[1] = uVar3;
      *(undefined8 *)(param_2 + 0x18) = 0;
      *(undefined8 *)(param_2 + 0x20) = 0;
      uVar3 = *(undefined8 *)(param_2 + 0x30);
      puVar13 = (undefined8 *)((long)_Var8._M_head_impl + lVar7 + 0x27);
      *puVar13 = *(undefined8 *)(param_2 + 0x28);
      puVar13[1] = uVar3;
      *(undefined8 *)((long)_Var8._M_head_impl + lVar7 + 0x37) = *(undefined8 *)(param_2 + 0x38);
      *(undefined8 *)(param_2 + 0x28) = 0;
      *(undefined8 *)(param_2 + 0x30) = 0;
      *(undefined8 *)(param_2 + 0x38) = 8;
      *(undefined8 *)((long)_Var8._M_head_impl + lVar7 + 0x3f) = *(undefined8 *)(param_2 + 0x40);
      *(undefined8 *)(param_2 + 0x40) = 0;
      *(undefined4 *)((long)_Var8._M_head_impl + lVar7 + 0x47) = 0xdeadbeef;
      ((local_38.
        super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
        .
        super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
       ._M_head_impl)->ptr).first = (Interface *)((long)_Var8._M_head_impl + lVar5);
      ((local_38.
        super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
        .
        super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
       ._M_head_impl)->ptr).second = (Interface *)((long)_Var8._M_head_impl + lVar5);
      ((local_38.
        super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
        .
        super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
       ._M_head_impl)->sf).first = 0x100;
      ((local_38.
        super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
        .
        super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
       ._M_head_impl)->sf).second = 0x40;
      puVar13 = *(undefined8 **)this;
      pvVar1 = *(void_pointer *)(this + 8);
      *(undefined4 *)this = local_68._storage._0_4_;
      *(undefined4 *)(this + 4) = local_68._storage._4_4_;
      *(undefined4 *)(this + 8) = local_68._end_storage._0_4_;
      *(undefined4 *)(this + 0xc) = local_68._end_storage._4_4_;
      puVar2 = *(undefined8 **)(this + 0x10);
      *(vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
        **)(this + 0x10) =
           local_38.
           super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
           .
           super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
           ._M_head_impl + 1;
      pvStack_50 = *(vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
                     **)(this + 0x18);
      *(vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
        **)(this + 0x18) =
           local_38.
           super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
           .
           super__Tuple_impl<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
           .
           super__Head_base<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
           ._M_head_impl;
      uVar3 = *(undefined8 *)(this + 0x20);
      *(ulong *)(this + 0x20) = local_48;
      local_68._storage = puVar13;
      local_68._end_storage = pvVar1;
      local_58 = (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
                  *)puVar2;
      local_48 = uVar3;
      for (; puVar2 != puVar13; puVar13 = puVar13 + 4) {
        (**(code **)(*(long *)puVar13[1] + 0x18))();
        puVar13[2] = 0;
        puVar13[3] = 0;
        *puVar13 = 0;
        puVar13[1] = 0;
      }
      local_48 = 8;
      puVar13 = (undefined8 *)local_68._storage;
      if (0x1f < (ulong)((long)pvStack_50 - (long)local_68._storage)) {
        do {
          puVar13[2] = 0;
          puVar13[3] = 0;
          *puVar13 = 0;
          puVar13[1] = 0;
          puVar13 = puVar13 + 4;
        } while (puVar13 !=
                 (undefined8 *)
                 (((long)pvStack_50 - (long)local_68._storage & 0xffffffffffffffe0U) +
                 (long)local_68._storage));
      }
      local_58 = (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
                  *)0x0;
      pvStack_50 = (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
                    *)0x0;
      operator_delete(local_68._storage,(long)local_68._end_storage - (long)local_68._storage);
      local_68._storage = (void_pointer)0x0;
      local_68._end_storage = (void_pointer)0x0;
      operator_delete((void *)0x0,0);
      return;
    }
  }
  __assert_fail("can_construct_new_elem(s, a)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/include/poly/vector.h"
                ,0x5a9,
                "void poly::vector<Interface, std::allocator<Interface>, poly::virtual_cloning_policy>::push_back_new_elem(type_tag<T>, Args &&...) [IF = Interface, Allocator = std::allocator<Interface>, CloningPolicy = poly::virtual_cloning_policy, T = Impl2T<poly::virtual_cloning_policy>, Args = <Impl2T<poly::virtual_cloning_policy>>]"
               );
}

Assistant:

inline void vector<I, A, C>::push_back_new_elem_w_storage_increase(
    type_tag<T> /* t */, Args&&... args)
{
    constexpr auto s                = sizeof(T);
    constexpr auto a                = alignof(T);
    constexpr auto noexcept_movable = interface_type_noexcept_movable::value;
    constexpr auto nothrow_ctor     = std::is_nothrow_constructible<T, Args...>::value;
    //////////////////////////////////////////
    const auto new_capacity = std::max(capacity() * 2, size_t(1));
    const auto sizes        = calculate_storage_size(new_capacity, s, a);
    vector v(allocator_traits::select_on_container_copy_construction(base().get_allocator_ref()));
    v.init_layout(sizes.first, new_capacity, sizes.second);
    push_back_new_elem_w_storage_increase_copy(
        v, std::integral_constant < bool, noexcept_movable&& nothrow_ctor > {});
    v.push_back_new_elem(type_tag<T> {}, std::forward<Args>(args)...);
    this->swap(v);
}